

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

bool __thiscall
cmGeneratorTarget::StrictTargetComparison::operator()
          (StrictTargetComparison *this,cmGeneratorTarget *t1,cmGeneratorTarget *t2)

{
  char *__s1;
  int iVar1;
  string *psVar2;
  
  iVar1 = strcmp((t1->Target->Name)._M_dataplus._M_p,(t2->Target->Name)._M_dataplus._M_p);
  if (iVar1 == 0) {
    psVar2 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(t1->LocalGenerator);
    __s1 = (psVar2->_M_dataplus)._M_p;
    psVar2 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(t2->LocalGenerator);
    iVar1 = strcmp(__s1,(psVar2->_M_dataplus)._M_p);
  }
  return SUB41((uint)iVar1 >> 0x1f,0);
}

Assistant:

bool cmGeneratorTarget::StrictTargetComparison::operator()(
  cmGeneratorTarget const* t1, cmGeneratorTarget const* t2) const
{
  int nameResult = strcmp(t1->GetName().c_str(), t2->GetName().c_str());
  if (nameResult == 0) {
    return strcmp(
             t1->GetLocalGenerator()->GetCurrentBinaryDirectory().c_str(),
             t2->GetLocalGenerator()->GetCurrentBinaryDirectory().c_str()) < 0;
  }
  return nameResult < 0;
}